

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

secp256k1_ecdsa_signature *
cfd::core::ParseSignature(secp256k1_ecdsa_signature *__return_storage_ptr__,ByteData *signature)

{
  secp256k1_context_struct *ctx_00;
  uchar *input64;
  CfdException *this;
  secp256k1_ecdsa_signature *result;
  string local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38 [28];
  int local_1c;
  secp256k1_context_struct *psStack_18;
  int ret;
  secp256k1_context_struct *ctx;
  ByteData *signature_local;
  
  ctx = (secp256k1_context_struct *)signature;
  ctx_00 = wally_get_secp_context();
  psStack_18 = ctx_00;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                     (ByteData *)ctx);
  input64 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_38);
  result._0_4_ = secp256k1_ecdsa_signature_parse_compact(ctx_00,__return_storage_ptr__,input64);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_38);
  local_1c = (int)result;
  if ((int)result != 1) {
    result._6_1_ = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_68,"Could not parse ECDSA signature.",
               (allocator *)((long)&result + 7));
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_68);
    result._6_1_ = 0;
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return __return_storage_ptr__;
}

Assistant:

secp256k1_ecdsa_signature ParseSignature(const ByteData& signature) {
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature result;
  auto ret = secp256k1_ecdsa_signature_parse_compact(
      ctx, &result, signature.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Could not parse ECDSA signature.");
  }

  return result;
}